

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O2

int __thiscall CSound::Init(CSound *this)

{
  long lVar1;
  IKernel *pIVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined4 extraout_var;
  CConfig *pCVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 uVar7;
  char *fmt;
  char *sys;
  long in_FS_OFFSET;
  SDL_AudioSpec Format;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 4) {
    *(undefined4 *)((long)&m_aChannels[0].m_Vol + lVar5) = 0xff;
  }
  this->m_SoundEnabled = 0;
  pIVar2 = (this->super_IEngineSound).super_ISound.super_IInterface.m_pKernel;
  iVar3 = (*pIVar2->_vptr_IKernel[2])(pIVar2,"config");
  pCVar6 = (CConfig *)
           (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x30))
                     ((long *)CONCAT44(extraout_var,iVar3));
  this->m_pConfig = pCVar6;
  pIVar2 = (this->super_IEngineSound).super_ISound.super_IInterface.m_pKernel;
  iVar3 = (*pIVar2->_vptr_IKernel[2])(pIVar2,"enginegraphics");
  this->m_pGraphics = (IEngineGraphics *)CONCAT44(extraout_var_00,iVar3);
  pIVar2 = (this->super_IEngineSound).super_ISound.super_IInterface.m_pKernel;
  iVar3 = (*pIVar2->_vptr_IKernel[2])(pIVar2,"storage");
  this->m_pStorage = (IStorage *)CONCAT44(extraout_var_01,iVar3);
  m_SoundLock = lock_create();
  if (this->m_pConfig->m_SndInit == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = SDL_InitSubSystem(0x10);
    if (iVar3 < 0) {
      uVar7 = SDL_GetError();
      sys = "gfx";
      fmt = "unable to init SDL audio: %s";
    }
    else {
      m_MixingRate = this->m_pConfig->m_SndRate;
      Format.format = 0x8010;
      Format.channels = '\x02';
      Format.samples = (Uint16)this->m_pConfig->m_SndBufferSize;
      Format.callback = SdlCallback;
      Format.userdata = (void *)0x0;
      iVar3 = 0;
      Format.freq = m_MixingRate;
      iVar4 = SDL_OpenAudio(&Format,0);
      if (-1 < iVar4) {
        dbg_msg("client/sound","sound init successful");
        iVar4 = this->m_pConfig->m_SndBufferSize;
        m_MaxFrames = iVar4 * 2;
        m_pMixBuffer = (int *)mem_alloc(iVar4 << 4);
        SDL_PauseAudio(0);
        this->m_SoundEnabled = 1;
        (*(this->super_IEngineSound).super_ISound.super_IInterface._vptr_IInterface[0xd])(this);
        goto LAB_001261d4;
      }
      uVar7 = SDL_GetError();
      sys = "client/sound";
      fmt = "unable to open audio: %s";
    }
    dbg_msg(sys,fmt,uVar7);
    iVar3 = -1;
  }
LAB_001261d4:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int CSound::Init()
{
	for(int i = 0; i < NUM_CHANNELS; ++i)
		m_aChannels[i].m_Vol = 255;

	m_SoundEnabled = 0;
	m_pConfig = Kernel()->RequestInterface<IConfigManager>()->Values();
	m_pGraphics = Kernel()->RequestInterface<IEngineGraphics>();
	m_pStorage = Kernel()->RequestInterface<IStorage>();

	SDL_AudioSpec Format;

	m_SoundLock = lock_create();

	if(!m_pConfig->m_SndInit)
		return 0;

	if(SDL_InitSubSystem(SDL_INIT_AUDIO) < 0)
	{
		dbg_msg("gfx", "unable to init SDL audio: %s", SDL_GetError());
		return -1;
	}

	m_MixingRate = m_pConfig->m_SndRate;

	// Set 16-bit stereo audio at 22Khz
	Format.freq = m_pConfig->m_SndRate; // ignore_convention
	Format.format = AUDIO_S16; // ignore_convention
	Format.channels = 2; // ignore_convention
	Format.samples = m_pConfig->m_SndBufferSize; // ignore_convention
	Format.callback = SdlCallback; // ignore_convention
	Format.userdata = NULL; // ignore_convention

	// Open the audio device and start playing sound!
	if(SDL_OpenAudio(&Format, NULL) < 0)
	{
		dbg_msg("client/sound", "unable to open audio: %s", SDL_GetError());
		return -1;
	}
	else
		dbg_msg("client/sound", "sound init successful");

	m_MaxFrames = m_pConfig->m_SndBufferSize*2;
	m_pMixBuffer = (int *)mem_alloc(m_MaxFrames*2*sizeof(int));

	SDL_PauseAudio(0);

	m_SoundEnabled = 1;
	Update(); // update the volume
	return 0;
}